

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
               (string *s,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  _Alloc_hider __format;
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *s_00;
  string str;
  string nextFmt;
  stringstream ss;
  char *local_228;
  undefined8 local_220;
  char local_218;
  undefined7 uStack_217;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  string local_200;
  char *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  char *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = fmt;
  copyToFormatString(&local_200,&local_1e0,s);
  lVar3 = std::__cxx11::string::find('\0',0x2a);
  lVar4 = std::__cxx11::string::find('\0',0x73);
  lVar5 = std::__cxx11::string::find('\0',100);
  if (lVar3 == -1) {
    if (lVar5 == -1) {
      if (lVar4 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(v->_M_dataplus)._M_p,v->_M_string_length);
        __format._M_p = local_200._M_dataplus._M_p;
        local_208 = args;
        std::__cxx11::stringbuf::str();
        plVar1 = local_1d8;
        iVar2 = snprintf((char *)0x0,0,__format._M_p,local_1d8);
        local_220 = 0;
        local_218 = '\0';
        local_228 = &local_218;
        std::__cxx11::string::resize((ulong)&local_228,(char)(iVar2 + 1));
        snprintf(local_228,(long)(iVar2 + 1),__format._M_p,plVar1);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)local_228);
        if (local_228 != &local_218) {
          operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
        }
        v_00 = local_208;
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        stringPrintfRecursive<std::__cxx11::string_const&>(s,local_1e0,v_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      if (local_200._M_string_length != 0) {
        local_228 = "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE";
        local_1b8[0] = local_200._M_dataplus._M_p;
        LogFatal<char_const*,char_const*&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                   ,0xb2,"Printf: Non-basic type %s passed for format string %s",&local_228,
                   local_1b8);
      }
      s_00 = "Excess values passed to Printf.";
      iVar2 = 0x10d;
    }
    else {
      s_00 = "Non-integral type passed to %d format.";
      iVar2 = 0x104;
    }
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    iVar2 = 0xe8;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,iVar2,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}